

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::NeuralNetworkLayer::MergeFrom
          (NeuralNetworkLayer *this,NeuralNetworkLayer *from)

{
  uint32 uVar1;
  void *pvVar2;
  ArenaStringPtr value;
  int iVar3;
  LogMessage *other;
  ConvolutionLayerParams *this_00;
  ConvolutionLayerParams *from_00;
  CumSumLayerParams *this_01;
  CumSumLayerParams *from_01;
  LessThanLayerParams *this_02;
  LessThanLayerParams *from_02;
  ScatterNDLayerParams *this_03;
  ScatterNDLayerParams *from_03;
  GreaterThanLayerParams *this_04;
  GreaterThanLayerParams *from_04;
  LessEqualLayerParams *this_05;
  LessEqualLayerParams *from_05;
  GreaterEqualLayerParams *this_06;
  GreaterEqualLayerParams *from_06;
  GatherAlongAxisLayerParams *this_07;
  GatherAlongAxisLayerParams *from_07;
  SoftmaxNDLayerParams *this_08;
  SoftmaxNDLayerParams *from_08;
  ScatterAlongAxisLayerParams *this_09;
  ScatterAlongAxisLayerParams *from_09;
  Convolution3DLayerParams *this_10;
  Convolution3DLayerParams *from_10;
  ClampedReLULayerParams *this_11;
  ClampedReLULayerParams *from_11;
  Pooling3DLayerParams *this_12;
  Pooling3DLayerParams *from_12;
  SliceBySizeLayerParams *this_13;
  SliceBySizeLayerParams *from_13;
  ArgSortLayerParams *this_14;
  ArgSortLayerParams *from_14;
  GlobalPooling3DLayerParams *this_15;
  GlobalPooling3DLayerParams *from_15;
  UpsampleLayerParams *this_16;
  UpsampleLayerParams *from_16;
  BiasLayerParams *this_17;
  BiasLayerParams *from_17;
  PaddingLayerParams *this_18;
  PaddingLayerParams *from_18;
  SliceLayerParams *this_19;
  SliceLayerParams *from_19;
  BatchnormLayerParams *this_20;
  BatchnormLayerParams *from_20;
  MaxLayerParams *this_21;
  MaxLayerParams *from_21;
  CoshLayerParams *this_22;
  CoshLayerParams *from_22;
  SimpleRecurrentLayerParams *this_23;
  SimpleRecurrentLayerParams *from_23;
  MeanVarianceNormalizeLayerParams *this_24;
  MeanVarianceNormalizeLayerParams *from_24;
  TanhLayerParams *this_25;
  TanhLayerParams *from_25;
  SinLayerParams *this_26;
  SinLayerParams *from_26;
  BiDirectionalLSTMLayerParams *this_27;
  BiDirectionalLSTMLayerParams *from_27;
  ErfLayerParams *this_28;
  ErfLayerParams *from_28;
  DotProductLayerParams *this_29;
  DotProductLayerParams *from_29;
  CeilLayerParams *this_30;
  CeilLayerParams *from_30;
  CustomLayerParams *this_31;
  CustomLayerParams *from_31;
  MinBroadcastableLayerParams *this_32;
  MinBroadcastableLayerParams *from_32;
  EqualLayerParams *this_33;
  EqualLayerParams *from_33;
  RoundLayerParams *this_34;
  RoundLayerParams *from_34;
  SlidingWindowsLayerParams *this_35;
  SlidingWindowsLayerParams *from_35;
  AsinLayerParams *this_36;
  AsinLayerParams *from_36;
  LoadConstantNDLayerParams *this_37;
  LoadConstantNDLayerParams *from_37;
  LoopLayerParams *this_38;
  LoopLayerParams *from_38;
  ConcatLayerParams *this_39;
  ConcatLayerParams *from_39;
  OneHotLayerParams *this_40;
  OneHotLayerParams *from_40;
  GRULayerParams *this_41;
  GRULayerParams *from_41;
  SplitLayerParams *this_42;
  SplitLayerParams *from_42;
  DivideBroadcastableLayerParams *this_43;
  DivideBroadcastableLayerParams *from_43;
  AtanhLayerParams *this_44;
  AtanhLayerParams *from_44;
  ModBroadcastableLayerParams *this_45;
  ModBroadcastableLayerParams *from_45;
  BroadcastToDynamicLayerParams *this_46;
  BroadcastToDynamicLayerParams *from_46;
  TransposeLayerParams *this_47;
  TransposeLayerParams *from_47;
  UniDirectionalLSTMLayerParams *this_48;
  UniDirectionalLSTMLayerParams *from_48;
  ArgMaxLayerParams *this_49;
  ArgMaxLayerParams *from_49;
  ReverseSeqLayerParams *this_50;
  ReverseSeqLayerParams *from_50;
  LogicalOrLayerParams *this_51;
  LogicalOrLayerParams *from_51;
  ExpandDimsLayerParams *this_52;
  ExpandDimsLayerParams *from_52;
  SqueezeLayerParams *this_53;
  SqueezeLayerParams *from_53;
  EmbeddingLayerParams *this_54;
  EmbeddingLayerParams *from_54;
  MaxBroadcastableLayerParams *this_55;
  MaxBroadcastableLayerParams *from_55;
  RandomNormalStaticLayerParams *this_56;
  RandomNormalStaticLayerParams *from_56;
  FlattenTo2DLayerParams *this_57;
  FlattenTo2DLayerParams *from_57;
  SoftmaxLayerParams *this_58;
  SoftmaxLayerParams *from_58;
  ResizeBilinearLayerParams *this_59;
  ResizeBilinearLayerParams *from_59;
  ReduceMaxLayerParams *this_60;
  ReduceMaxLayerParams *from_60;
  PowBroadcastableLayerParams *this_61;
  PowBroadcastableLayerParams *from_61;
  GetShapeLayerParams *this_62;
  GetShapeLayerParams *from_62;
  ReduceSumLayerParams *this_63;
  ReduceSumLayerParams *from_63;
  ReshapeLikeLayerParams *this_64;
  ReshapeLikeLayerParams *from_64;
  ArgMinLayerParams *this_65;
  ArgMinLayerParams *from_65;
  ReshapeLayerParams *this_66;
  ReshapeLayerParams *from_66;
  GatherNDLayerParams *this_67;
  GatherNDLayerParams *from_67;
  CropResizeLayerParams *this_68;
  CropResizeLayerParams *from_68;
  AsinhLayerParams *this_69;
  AsinhLayerParams *from_69;
  ReduceLogSumLayerParams *this_70;
  ReduceLogSumLayerParams *from_70;
  MinLayerParams *this_71;
  MinLayerParams *from_71;
  AcoshLayerParams *this_72;
  AcoshLayerParams *from_72;
  TopKLayerParams *this_73;
  TopKLayerParams *from_73;
  WhereBroadcastableLayerParams *this_74;
  WhereBroadcastableLayerParams *from_74;
  FillDynamicLayerParams *this_75;
  FillDynamicLayerParams *from_75;
  AddLayerParams *this_76;
  AddLayerParams *from_76;
  GatherLayerParams *this_77;
  GatherLayerParams *from_77;
  MultiplyBroadcastableLayerParams *this_78;
  MultiplyBroadcastableLayerParams *from_78;
  ReduceMeanLayerParams *this_79;
  ReduceMeanLayerParams *from_79;
  ReduceLogSumExpLayerParams *this_80;
  ReduceLogSumExpLayerParams *from_80;
  RandomUniformLikeLayerParams *this_81;
  RandomUniformLikeLayerParams *from_81;
  RandomUniformStaticLayerParams *this_82;
  RandomUniformStaticLayerParams *from_82;
  NonMaximumSuppressionLayerParams *this_83;
  NonMaximumSuppressionLayerParams *from_83;
  ReduceMinLayerParams *this_84;
  ReduceMinLayerParams *from_84;
  AverageLayerParams *this_85;
  AverageLayerParams *from_85;
  SubtractBroadcastableLayerParams *this_86;
  SubtractBroadcastableLayerParams *from_86;
  LayerNormalizationLayerParams *this_87;
  LayerNormalizationLayerParams *from_87;
  MatrixBandPartLayerParams *this_88;
  MatrixBandPartLayerParams *from_88;
  Exp2LayerParams *this_89;
  Exp2LayerParams *from_89;
  RangeDynamicLayerParams *this_90;
  RangeDynamicLayerParams *from_90;
  ReshapeDynamicLayerParams *this_91;
  ReshapeDynamicLayerParams *from_91;
  ReduceL2LayerParams *this_92;
  ReduceL2LayerParams *from_92;
  SignLayerParams *this_93;
  undefined4 extraout_var;
  FillStaticLayerParams *this_94;
  FillStaticLayerParams *from_93;
  NotEqualLayerParams *this_95;
  NotEqualLayerParams *from_94;
  RandomBernoulliDynamicLayerParams *this_96;
  RandomBernoulliDynamicLayerParams *from_95;
  StackLayerParams *this_97;
  StackLayerParams *from_96;
  UpperTriangularLayerParams *this_98;
  UpperTriangularLayerParams *from_97;
  FloorDivBroadcastableLayerParams *this_99;
  FloorDivBroadcastableLayerParams *from_98;
  TileLayerParams *this_x00100;
  TileLayerParams *from_99;
  RandomBernoulliStaticLayerParams *this_x00101;
  RandomBernoulliStaticLayerParams *from_x00100;
  ReduceProdLayerParams *this_x00102;
  ReduceProdLayerParams *from_x00101;
  LowerTriangularLayerParams *this_x00103;
  LowerTriangularLayerParams *from_x00102;
  ReduceL1LayerParams *this_x00104;
  ReduceL1LayerParams *from_x00103;
  ReduceSumSquareLayerParams *this_x00105;
  ReduceSumSquareLayerParams *from_x00104;
  WhereNonZeroLayerParams *this_x00106;
  WhereNonZeroLayerParams *from_x00105;
  RankPreservingReshapeLayerParams *this_x00107;
  RankPreservingReshapeLayerParams *from_x00106;
  ReshapeStaticLayerParams *this_x00108;
  ReshapeStaticLayerParams *from_x00107;
  BatchedMatMulLayerParams *this_x00109;
  BatchedMatMulLayerParams *from_x00108;
  MultiplyLayerParams *this_x00110;
  MultiplyLayerParams *from_x00109;
  UnaryFunctionLayerParams *this_x00111;
  UnaryFunctionLayerParams *from_x00110;
  SinhLayerParams *this_x00112;
  SinhLayerParams *from_x00111;
  RandomBernoulliLikeLayerParams *this_x00113;
  RandomBernoulliLikeLayerParams *from_x00112;
  AtanLayerParams *this_x00114;
  AtanLayerParams *from_x00113;
  PermuteLayerParams *this_x00115;
  PermuteLayerParams *from_x00114;
  ReduceLayerParams *this_x00116;
  ReduceLayerParams *from_x00115;
  SequenceRepeatLayerParams *this_x00117;
  SequenceRepeatLayerParams *from_x00116;
  LoadConstantLayerParams *this_x00118;
  LoadConstantLayerParams *from_x00117;
  BroadcastToLikeLayerParams *this_x00119;
  BroadcastToLikeLayerParams *from_x00118;
  CategoricalDistributionLayerParams *this_x00120;
  CategoricalDistributionLayerParams *from_x00119;
  ReverseLayerParams *this_x00121;
  ReverseLayerParams *from_x00120;
  FillLikeLayerParams *this_x00122;
  FillLikeLayerParams *from_x00121;
  ScatterLayerParams *this_x00123;
  ScatterLayerParams *from_x00122;
  RandomUniformDynamicLayerParams *this_x00124;
  RandomUniformDynamicLayerParams *from_x00123;
  RandomNormalLikeLayerParams *this_x00125;
  RandomNormalLikeLayerParams *from_x00124;
  ConstantPaddingLayerParams *this_x00126;
  ConstantPaddingLayerParams *from_x00125;
  FlattenLayerParams *this_x00127;
  FlattenLayerParams *from_x00126;
  BroadcastToStaticLayerParams *this_x00128;
  BroadcastToStaticLayerParams *from_x00127;
  RandomNormalDynamicLayerParams *this_x00129;
  RandomNormalDynamicLayerParams *from_x00128;
  ConcatNDLayerParams *this_x00130;
  ConcatNDLayerParams *from_x00129;
  ReorganizeDataLayerParams *this_x00131;
  ReorganizeDataLayerParams *from_x00130;
  L2NormalizeLayerParams *this_x00132;
  L2NormalizeLayerParams *from_x00131;
  LogicalAndLayerParams *this_x00133;
  LogicalAndLayerParams *from_x00132;
  SplitNDLayerParams *this_x00134;
  SplitNDLayerParams *from_x00133;
  ScaleLayerParams *this_x00135;
  ScaleLayerParams *from_x00134;
  SliceStaticLayerParams *this_x00136;
  SliceStaticLayerParams *from_x00135;
  EmbeddingNDLayerParams *this_x00137;
  EmbeddingNDLayerParams *from_x00136;
  LogicalNotLayerParams *this_x00138;
  LogicalNotLayerParams *from_x00137;
  PoolingLayerParams *this_x00139;
  PoolingLayerParams *from_x00138;
  AcosLayerParams *this_x00140;
  AcosLayerParams *from_x00139;
  LogicalXorLayerParams *this_x00141;
  LogicalXorLayerParams *from_x00140;
  CopyLayerParams *this_x00142;
  undefined4 extraout_var_00;
  SliceDynamicLayerParams *this_x00143;
  SliceDynamicLayerParams *from_x00141;
  BranchLayerParams *this_x00144;
  BranchLayerParams *from_x00142;
  GeluLayerParams *this_x00145;
  GeluLayerParams *from_x00143;
  LoopBreakLayerParams *this_x00146;
  LoopBreakLayerParams *from_x00144;
  AddBroadcastableLayerParams *this_x00147;
  AddBroadcastableLayerParams *from_x00145;
  FloorLayerParams *this_x00148;
  FloorLayerParams *from_x00146;
  LoopContinueLayerParams *this_x00149;
  LoopContinueLayerParams *from_x00147;
  LRNLayerParams *this_x00150;
  LRNLayerParams *from_x00148;
  CosLayerParams *this_x00151;
  CosLayerParams *from_x00149;
  TanLayerParams *this_x00152;
  TanLayerParams *from_x00150;
  ActivationParams *this_x00153;
  ActivationParams *from_x00151;
  ClipLayerParams *this_x00154;
  ClipLayerParams *from_x00152;
  CropLayerParams *this_x00155;
  CropLayerParams *from_x00153;
  RangeStaticLayerParams *this_x00156;
  RangeStaticLayerParams *from_x00154;
  InnerProductLayerParams *this_x00157;
  InnerProductLayerParams *from_x00155;
  size_t *siglen;
  uchar *sig;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *other_00;
  uchar *in_R8;
  size_t in_R9;
  double __x;
  double __x_00;
  double __x_01;
  double extraout_XMM0_Qa;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  double __x_08;
  double __x_09;
  double __x_10;
  double __x_11;
  double __x_12;
  double __x_13;
  double __x_14;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x33b9);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->input_).super_RepeatedPtrFieldBase,&(from->input_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->output_).super_RepeatedPtrFieldBase,&(from->output_).super_RepeatedPtrFieldBase
            );
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
            (&(this->inputtensor_).super_RepeatedPtrFieldBase,
             &(from->inputtensor_).super_RepeatedPtrFieldBase);
  other_00 = (EVP_PKEY_CTX *)&from->outputtensor_;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
            (&(this->outputtensor_).super_RepeatedPtrFieldBase,(RepeatedPtrFieldBase *)other_00);
  value.ptr_ = (from->name_).ptr_;
  if ((value.ptr_)->_M_string_length != 0) {
    other_00 = (EVP_PKEY_CTX *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->name_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,value);
  }
  if (from->isupdatable_ == true) {
    this->isupdatable_ = true;
  }
  uVar1 = from->_oneof_case_[0];
  switch(uVar1) {
  case 0x5af:
    this_01 = mutable_cumsum(this);
    from_01 = cumsum(from);
    CumSumLayerParams::MergeFrom(this_01,from_01);
    break;
  case 0x5b0:
  case 0x5b1:
  case 0x5b2:
  case 0x5b3:
  case 0x5b6:
  case 0x5b7:
  case 0x5b8:
  case 0x5bb:
  case 0x5bc:
  case 0x5bd:
    break;
  case 0x5b4:
    this_11 = mutable_clampedrelu(this);
    from_11 = clampedrelu(from);
    ClampedReLULayerParams::MergeFrom(this_11,from_11);
    break;
  case 0x5b5:
    this_14 = mutable_argsort(this);
    from_14 = argsort(from);
    ArgSortLayerParams::MergeFrom(this_14,from_14);
    break;
  case 0x5b9:
    this_12 = mutable_pooling3d(this);
    from_12 = pooling3d(from);
    Pooling3DLayerParams::MergeFrom(this_12,from_12);
    break;
  case 0x5ba:
    this_15 = mutable_globalpooling3d(this);
    from_15 = globalpooling3d(from);
    GlobalPooling3DLayerParams::MergeFrom(this_15,from_15);
    break;
  case 0x5be:
    this_13 = mutable_slicebysize(this);
    from_13 = slicebysize(from);
    SliceBySizeLayerParams::MergeFrom(this_13,from_13);
    break;
  case 0x5bf:
    this_10 = mutable_convolution3d(this);
    from_10 = convolution3d(from);
    Convolution3DLayerParams::MergeFrom(this_10,from_10);
    break;
  default:
    switch(uVar1) {
    case 0x339:
      this_02 = mutable_lessthan(this);
      from_02 = lessthan(from);
      LessThanLayerParams::MergeFrom(this_02,from_02);
      break;
    case 0x33a:
    case 0x33c:
    case 0x33d:
    case 0x33f:
      break;
    case 0x33b:
      this_05 = mutable_lessequal(this);
      from_05 = lessequal(from);
      LessEqualLayerParams::MergeFrom(this_05,from_05);
      break;
    case 0x33e:
      this_04 = mutable_greaterthan(this);
      from_04 = greaterthan(from);
      GreaterThanLayerParams::MergeFrom(this_04,from_04);
      break;
    case 0x340:
      this_06 = mutable_greaterequal(this);
      from_06 = greaterequal(from);
      GreaterEqualLayerParams::MergeFrom(this_06,from_06);
      break;
    default:
      siglen = (size_t *)(ulong)(uVar1 - 0x3b1);
      switch(siglen) {
      case (size_t *)0x0:
        this_03 = mutable_scatternd(this);
        from_03 = scatternd(from);
        ScatterNDLayerParams::MergeFrom(this_03,from_03);
        break;
      case (size_t *)0x1:
      case (size_t *)0x2:
      case (size_t *)0x3:
      case (size_t *)0x4:
      case (size_t *)0x6:
      case (size_t *)0x8:
        break;
      case (size_t *)0x5:
        this_08 = mutable_softmaxnd(this);
        from_08 = softmaxnd(from);
        SoftmaxNDLayerParams::MergeFrom(this_08,from_08);
        break;
      case (size_t *)0x7:
        this_07 = mutable_gatheralongaxis(this);
        from_07 = gatheralongaxis(from);
        GatherAlongAxisLayerParams::MergeFrom(this_07,from_07);
        break;
      case (size_t *)0x9:
        this_09 = mutable_scatteralongaxis(this);
        from_09 = scatteralongaxis(from);
        ScatterAlongAxisLayerParams::MergeFrom(this_09,from_09);
        break;
      default:
        if (uVar1 == 0x5aa) {
          this_40 = mutable_onehot(this);
          from_40 = onehot(from);
          OneHotLayerParams::MergeFrom(this_40,from_40);
        }
        else if (uVar1 == 0x78) {
          this_x00139 = mutable_pooling(this);
          from_x00138 = pooling(from);
          PoolingLayerParams::MergeFrom(this_x00139,from_x00138);
        }
        else if (uVar1 == 0x82) {
          this_x00153 = mutable_activation(this);
          from_x00151 = activation(from);
          ActivationParams::MergeFrom(this_x00153,from_x00151);
        }
        else if (uVar1 == 0x8c) {
          this_x00157 = mutable_innerproduct(this);
          from_x00155 = innerproduct(from);
          InnerProductLayerParams::MergeFrom(this_x00157,from_x00155);
        }
        else if (uVar1 == 0x96) {
          this_54 = mutable_embedding(this);
          from_54 = embedding(from);
          EmbeddingLayerParams::MergeFrom(this_54,from_54);
        }
        else if (uVar1 == 0xa0) {
          this_20 = mutable_batchnorm(this);
          from_20 = batchnorm(from);
          BatchnormLayerParams::MergeFrom(this_20,from_20);
        }
        else if (uVar1 == 0xa5) {
          this_24 = mutable_mvn(this);
          from_24 = mvn(from);
          MeanVarianceNormalizeLayerParams::MergeFrom(this_24,from_24);
        }
        else if (uVar1 == 0xaa) {
          this_x00132 = mutable_l2normalize(this);
          from_x00131 = l2normalize(from);
          L2NormalizeLayerParams::MergeFrom(this_x00132,from_x00131);
        }
        else if (uVar1 == 0xaf) {
          this_58 = mutable_softmax(this);
          from_58 = softmax(from);
          SoftmaxLayerParams::MergeFrom(this_58,from_58);
        }
        else if (uVar1 == 0xb4) {
          this_x00150 = mutable_lrn(this);
          from_x00148 = lrn(from);
          LRNLayerParams::MergeFrom(this_x00150,from_x00148);
        }
        else if (uVar1 == 0xbe) {
          this_x00155 = mutable_crop(this);
          from_x00153 = crop(from);
          CropLayerParams::MergeFrom(this_x00155,from_x00153);
        }
        else if (uVar1 == 200) {
          this_18 = mutable_padding(this);
          from_18 = padding(from);
          PaddingLayerParams::MergeFrom(this_18,from_18);
        }
        else if (uVar1 == 0xd2) {
          this_16 = mutable_upsample(this);
          from_16 = upsample(from);
          UpsampleLayerParams::MergeFrom(this_16,from_16);
        }
        else if (uVar1 == 0xd3) {
          this_59 = mutable_resizebilinear(this);
          from_59 = resizebilinear(from);
          ResizeBilinearLayerParams::MergeFrom(this_59,from_59);
        }
        else if (uVar1 == 0xd4) {
          this_68 = mutable_cropresize(this);
          from_68 = cropresize(from);
          CropResizeLayerParams::MergeFrom(this_68,from_68);
        }
        else if (uVar1 == 0xdc) {
          this_x00111 = mutable_unary(this);
          from_x00110 = unary(from);
          UnaryFunctionLayerParams::MergeFrom(this_x00111,from_x00110);
        }
        else if (uVar1 == 0xe6) {
          this_76 = mutable_add(this);
          from_76 = add(from);
          AddLayerParams::MergeFrom(this_76,from_76);
        }
        else if (uVar1 == 0xe7) {
          this_x00110 = mutable_multiply(this);
          from_x00109 = multiply(from);
          MultiplyLayerParams::MergeFrom(this_x00110,from_x00109);
        }
        else if (uVar1 == 0xf0) {
          this_85 = mutable_average(this);
          from_85 = average(from);
          AverageLayerParams::MergeFrom(this_85,from_85);
        }
        else if (uVar1 == 0xf5) {
          this_x00135 = mutable_scale(this);
          from_x00134 = scale(from);
          ScaleLayerParams::MergeFrom(this_x00135,from_x00134);
        }
        else if (uVar1 == 0xfa) {
          this_17 = mutable_bias(this);
          from_17 = bias(from);
          BiasLayerParams::MergeFrom(this_17,from_17);
        }
        else if (uVar1 == 0x104) {
          this_21 = mutable_max(this);
          from_21 = max(from);
          MaxLayerParams::MergeFrom(this_21,from_21);
        }
        else if (uVar1 == 0x105) {
          this_71 = mutable_min(this);
          from_71 = min(from);
          MinLayerParams::MergeFrom(this_71,from_71);
        }
        else if (uVar1 == 0x10e) {
          this_29 = mutable_dot(this);
          from_29 = dot(from);
          DotProductLayerParams::MergeFrom(this_29,from_29);
        }
        else if (uVar1 == 0x118) {
          this_x00116 = mutable_reduce(this);
          from_x00115 = reduce(from);
          ReduceLayerParams::MergeFrom(this_x00116,from_x00115);
        }
        else if (uVar1 == 0x122) {
          this_x00118 = mutable_loadconstant(this);
          from_x00117 = loadconstant(from);
          LoadConstantLayerParams::MergeFrom(this_x00118,from_x00117);
        }
        else if (uVar1 == 300) {
          this_66 = mutable_reshape(this);
          from_66 = reshape(from);
          ReshapeLayerParams::MergeFrom(this_66,from_66);
        }
        else if (uVar1 == 0x12d) {
          this_x00127 = mutable_flatten(this);
          from_x00126 = flatten(from);
          FlattenLayerParams::MergeFrom(this_x00127,from_x00126);
        }
        else if (uVar1 == 0x136) {
          this_x00115 = mutable_permute(this);
          from_x00114 = permute(from);
          PermuteLayerParams::MergeFrom(this_x00115,from_x00114);
        }
        else if (uVar1 == 0x140) {
          this_39 = mutable_concat(this);
          from_39 = concat(from);
          ConcatLayerParams::MergeFrom(this_39,from_39);
        }
        else if (uVar1 == 0x14a) {
          this_42 = mutable_split(this);
          from_42 = split(from);
          SplitLayerParams::MergeFrom(this_42,from_42);
        }
        else if (uVar1 == 0x154) {
          this_x00117 = mutable_sequencerepeat(this);
          from_x00116 = sequencerepeat(from);
          SequenceRepeatLayerParams::MergeFrom(this_x00117,from_x00116);
        }
        else if (uVar1 == 0x159) {
          this_x00131 = mutable_reorganizedata(this);
          from_x00130 = reorganizedata(from);
          ReorganizeDataLayerParams::MergeFrom(this_x00131,from_x00130);
        }
        else if (uVar1 == 0x15e) {
          this_19 = mutable_slice(this);
          from_19 = slice(from);
          SliceLayerParams::MergeFrom(this_19,from_19);
        }
        else if (uVar1 == 400) {
          this_23 = mutable_simplerecurrent(this);
          from_23 = simplerecurrent(from);
          SimpleRecurrentLayerParams::MergeFrom(this_23,from_23);
        }
        else if (uVar1 == 0x19a) {
          this_41 = mutable_gru(this);
          from_41 = gru(from);
          GRULayerParams::MergeFrom(this_41,from_41);
        }
        else if (uVar1 == 0x1a4) {
          this_48 = mutable_unidirectionallstm(this);
          from_48 = unidirectionallstm(from);
          UniDirectionalLSTMLayerParams::MergeFrom(this_48,from_48);
        }
        else if (uVar1 == 0x1ae) {
          this_27 = mutable_bidirectionallstm(this);
          from_27 = bidirectionallstm(from);
          BiDirectionalLSTMLayerParams::MergeFrom(this_27,from_27);
        }
        else if (uVar1 == 500) {
          this_31 = mutable_custom(this);
          from_31 = custom(from);
          CustomLayerParams::MergeFrom(this_31,from_31);
        }
        else if (uVar1 == 600) {
          this_x00142 = mutable_copy(this);
          iVar3 = copy(from,other_00,src);
          CopyLayerParams::MergeFrom(this_x00142,(CopyLayerParams *)CONCAT44(extraout_var_00,iVar3))
          ;
        }
        else if (uVar1 == 0x25d) {
          this_x00144 = mutable_branch(this);
          from_x00142 = branch(from);
          BranchLayerParams::MergeFrom(this_x00144,from_x00142);
        }
        else if (uVar1 == 0x267) {
          this_38 = mutable_loop(this);
          from_38 = loop(from);
          LoopLayerParams::MergeFrom(this_38,from_38);
        }
        else if (uVar1 == 0x26c) {
          this_x00146 = mutable_loopbreak(this);
          from_x00144 = loopbreak(from);
          LoopBreakLayerParams::MergeFrom(this_x00146,from_x00144);
        }
        else if (uVar1 == 0x271) {
          this_x00149 = mutable_loopcontinue(this);
          from_x00147 = loopcontinue(from);
          LoopContinueLayerParams::MergeFrom(this_x00149,from_x00147);
        }
        else if (uVar1 == 0x27b) {
          this_x00156 = mutable_rangestatic(this);
          from_x00154 = rangestatic(from);
          RangeStaticLayerParams::MergeFrom(this_x00156,from_x00154);
        }
        else if (uVar1 == 0x280) {
          this_90 = mutable_rangedynamic(this);
          from_90 = rangedynamic(from);
          RangeDynamicLayerParams::MergeFrom(this_90,from_90);
        }
        else if (uVar1 == 0x294) {
          this_x00154 = mutable_clip(this);
          from_x00152 = clip(from);
          ClipLayerParams::MergeFrom(this_x00154,from_x00152);
        }
        else if (uVar1 == 0x299) {
          this_30 = mutable_ceil(this);
          ceil(from,__x_02);
          CeilLayerParams::MergeFrom(this_30,from_30);
        }
        else if (uVar1 == 0x29e) {
          this_x00148 = mutable_floor(this);
          floor(from,__x_12);
          FloorLayerParams::MergeFrom(this_x00148,from_x00146);
        }
        else if (uVar1 == 0x2a8) {
          this_93 = mutable_sign(this);
          iVar3 = sign(from,other_00,sig,siglen,in_R8,in_R9);
          SignLayerParams::MergeFrom(this_93,(SignLayerParams *)CONCAT44(extraout_var,iVar3));
        }
        else if (uVar1 == 0x2ad) {
          this_34 = mutable_round(this);
          round(from,__x_03);
          RoundLayerParams::MergeFrom(this_34,from_34);
        }
        else if (uVar1 == 700) {
          this_89 = mutable_exp2(this);
          exp2(from,__x_08);
          Exp2LayerParams::MergeFrom(this_89,from_89);
        }
        else if (uVar1 == 0x2c6) {
          this_26 = mutable_sin(this);
          sin(from,__x_01);
          SinLayerParams::MergeFrom(this_26,from_26);
        }
        else if (uVar1 == 0x2cb) {
          this_x00151 = mutable_cos(this);
          cos(from,__x_13);
          CosLayerParams::MergeFrom(this_x00151,from_x00149);
        }
        else if (uVar1 == 0x2d0) {
          this_x00152 = mutable_tan(this);
          tan(from,__x_14);
          TanLayerParams::MergeFrom(this_x00152,from_x00150);
        }
        else if (uVar1 == 0x2da) {
          this_36 = mutable_asin(this);
          asin(from,__x_04);
          AsinLayerParams::MergeFrom(this_36,from_36);
        }
        else if (uVar1 == 0x2df) {
          this_x00140 = mutable_acos(this);
          acos(from,__x_11);
          AcosLayerParams::MergeFrom(this_x00140,from_x00139);
        }
        else if (uVar1 == 0x2e4) {
          this_x00114 = mutable_atan(this);
          atan(from,__x_10);
          AtanLayerParams::MergeFrom(this_x00114,from_x00113);
        }
        else if (uVar1 == 0x2ee) {
          this_x00112 = mutable_sinh(this);
          sinh(from,__x_09);
          SinhLayerParams::MergeFrom(this_x00112,from_x00111);
        }
        else if (uVar1 == 0x2f3) {
          this_22 = mutable_cosh(this);
          cosh(from,__x);
          CoshLayerParams::MergeFrom(this_22,from_22);
        }
        else if (uVar1 == 0x2f8) {
          this_25 = mutable_tanh(this);
          tanh(from,__x_00);
          TanhLayerParams::MergeFrom(this_25,from_25);
        }
        else if (uVar1 == 0x302) {
          this_69 = mutable_asinh(this);
          asinh(from,__x_06);
          AsinhLayerParams::MergeFrom(this_69,from_69);
        }
        else if (uVar1 == 0x307) {
          this_72 = mutable_acosh(this);
          acosh(from,__x_07);
          AcoshLayerParams::MergeFrom(this_72,from_72);
        }
        else if (uVar1 == 0x30c) {
          this_44 = mutable_atanh(this);
          atanh(from,__x_05);
          AtanhLayerParams::MergeFrom(this_44,from_44);
        }
        else if (uVar1 == 0x316) {
          this_28 = mutable_erf(this);
          erf(from,extraout_XMM0_Qa);
          ErfLayerParams::MergeFrom(this_28,from_28);
        }
        else if (uVar1 == 0x31b) {
          this_x00145 = mutable_gelu(this);
          from_x00143 = gelu(from);
          GeluLayerParams::MergeFrom(this_x00145,from_x00143);
        }
        else if (uVar1 == 0x32f) {
          this_33 = mutable_equal(this);
          from_33 = equal(from);
          EqualLayerParams::MergeFrom(this_33,from_33);
        }
        else if (uVar1 == 0x334) {
          this_95 = mutable_notequal(this);
          from_94 = notequal(from);
          NotEqualLayerParams::MergeFrom(this_95,from_94);
        }
        else if (uVar1 == 0x348) {
          this_51 = mutable_logicalor(this);
          from_51 = logicalor(from);
          LogicalOrLayerParams::MergeFrom(this_51,from_51);
        }
        else if (uVar1 == 0x34d) {
          this_x00141 = mutable_logicalxor(this);
          from_x00140 = logicalxor(from);
          LogicalXorLayerParams::MergeFrom(this_x00141,from_x00140);
        }
        else if (uVar1 == 0x352) {
          this_x00138 = mutable_logicalnot(this);
          from_x00137 = logicalnot(from);
          LogicalNotLayerParams::MergeFrom(this_x00138,from_x00137);
        }
        else if (uVar1 == 0x357) {
          this_x00133 = mutable_logicaland(this);
          from_x00132 = logicaland(from);
          LogicalAndLayerParams::MergeFrom(this_x00133,from_x00132);
        }
        else if (uVar1 == 0x361) {
          this_45 = mutable_modbroadcastable(this);
          from_45 = modbroadcastable(from);
          ModBroadcastableLayerParams::MergeFrom(this_45,from_45);
        }
        else if (uVar1 == 0x366) {
          this_32 = mutable_minbroadcastable(this);
          from_32 = minbroadcastable(from);
          MinBroadcastableLayerParams::MergeFrom(this_32,from_32);
        }
        else if (uVar1 == 0x36b) {
          this_55 = mutable_maxbroadcastable(this);
          from_55 = maxbroadcastable(from);
          MaxBroadcastableLayerParams::MergeFrom(this_55,from_55);
        }
        else if (uVar1 == 0x370) {
          this_x00147 = mutable_addbroadcastable(this);
          from_x00145 = addbroadcastable(from);
          AddBroadcastableLayerParams::MergeFrom(this_x00147,from_x00145);
        }
        else if (uVar1 == 0x375) {
          this_61 = mutable_powbroadcastable(this);
          from_61 = powbroadcastable(from);
          PowBroadcastableLayerParams::MergeFrom(this_61,from_61);
        }
        else if (uVar1 == 0x37a) {
          this_43 = mutable_dividebroadcastable(this);
          from_43 = dividebroadcastable(from);
          DivideBroadcastableLayerParams::MergeFrom(this_43,from_43);
        }
        else if (uVar1 == 0x37f) {
          this_99 = mutable_floordivbroadcastable(this);
          from_98 = floordivbroadcastable(from);
          FloorDivBroadcastableLayerParams::MergeFrom(this_99,from_98);
        }
        else if (uVar1 == 900) {
          this_78 = mutable_multiplybroadcastable(this);
          from_78 = multiplybroadcastable(from);
          MultiplyBroadcastableLayerParams::MergeFrom(this_78,from_78);
        }
        else if (uVar1 == 0x389) {
          this_86 = mutable_subtractbroadcastable(this);
          from_86 = subtractbroadcastable(from);
          SubtractBroadcastableLayerParams::MergeFrom(this_86,from_86);
        }
        else if (uVar1 == 0x398) {
          this_x00100 = mutable_tile(this);
          from_99 = tile(from);
          TileLayerParams::MergeFrom(this_x00100,from_99);
        }
        else if (uVar1 == 0x39d) {
          this_97 = mutable_stack(this);
          from_96 = stack(from);
          StackLayerParams::MergeFrom(this_97,from_96);
        }
        else if (uVar1 == 0x3a2) {
          this_77 = mutable_gather(this);
          from_77 = gather(from);
          GatherLayerParams::MergeFrom(this_77,from_77);
        }
        else if (uVar1 == 0x3a7) {
          this_x00123 = mutable_scatter(this);
          from_x00122 = scatter(from);
          ScatterLayerParams::MergeFrom(this_x00123,from_x00122);
        }
        else if (uVar1 == 0x3ac) {
          this_67 = mutable_gathernd(this);
          from_67 = gathernd(from);
          GatherNDLayerParams::MergeFrom(this_67,from_67);
        }
        else if (uVar1 == 0x3c0) {
          this_x00121 = mutable_reverse(this);
          from_x00120 = reverse(from);
          ReverseLayerParams::MergeFrom(this_x00121,from_x00120);
        }
        else if (uVar1 == 0x3c5) {
          this_50 = mutable_reverseseq(this);
          from_50 = reverseseq(from);
          ReverseSeqLayerParams::MergeFrom(this_50,from_50);
        }
        else if (uVar1 == 0x3cf) {
          this_x00134 = mutable_splitnd(this);
          from_x00133 = splitnd(from);
          SplitNDLayerParams::MergeFrom(this_x00134,from_x00133);
        }
        else if (uVar1 == 0x3d4) {
          this_x00130 = mutable_concatnd(this);
          from_x00129 = concatnd(from);
          ConcatNDLayerParams::MergeFrom(this_x00130,from_x00129);
        }
        else if (uVar1 == 0x3d9) {
          this_47 = mutable_transpose(this);
          from_47 = transpose(from);
          TransposeLayerParams::MergeFrom(this_47,from_47);
        }
        else if (uVar1 == 0x3e3) {
          this_x00136 = mutable_slicestatic(this);
          from_x00135 = slicestatic(from);
          SliceStaticLayerParams::MergeFrom(this_x00136,from_x00135);
        }
        else if (uVar1 == 1000) {
          this_x00143 = mutable_slicedynamic(this);
          from_x00141 = slicedynamic(from);
          SliceDynamicLayerParams::MergeFrom(this_x00143,from_x00141);
        }
        else if (uVar1 == 0x3ed) {
          this_35 = mutable_slidingwindows(this);
          from_35 = slidingwindows(from);
          SlidingWindowsLayerParams::MergeFrom(this_35,from_35);
        }
        else if (uVar1 == 0x3f7) {
          this_73 = mutable_topk(this);
          from_73 = topk(from);
          TopKLayerParams::MergeFrom(this_73,from_73);
        }
        else if (uVar1 == 0x3fc) {
          this_65 = mutable_argmin(this);
          from_65 = argmin(from);
          ArgMinLayerParams::MergeFrom(this_65,from_65);
        }
        else if (uVar1 == 0x401) {
          this_49 = mutable_argmax(this);
          from_49 = argmax(from);
          ArgMaxLayerParams::MergeFrom(this_49,from_49);
        }
        else if (uVar1 == 0x410) {
          this_x00137 = mutable_embeddingnd(this);
          from_x00136 = embeddingnd(from);
          EmbeddingNDLayerParams::MergeFrom(this_x00137,from_x00136);
        }
        else if (uVar1 == 0x415) {
          this_x00109 = mutable_batchedmatmul(this);
          from_x00108 = batchedmatmul(from);
          BatchedMatMulLayerParams::MergeFrom(this_x00109,from_x00108);
        }
        else if (uVar1 == 0x429) {
          this_62 = mutable_getshape(this);
          from_62 = getshape(from);
          GetShapeLayerParams::MergeFrom(this_62,from_62);
        }
        else if (uVar1 == 0x42e) {
          this_37 = mutable_loadconstantnd(this);
          from_37 = loadconstantnd(from);
          LoadConstantNDLayerParams::MergeFrom(this_37,from_37);
        }
        else if (uVar1 == 0x438) {
          this_x00122 = mutable_filllike(this);
          from_x00121 = filllike(from);
          FillLikeLayerParams::MergeFrom(this_x00122,from_x00121);
        }
        else if (uVar1 == 0x43d) {
          this_94 = mutable_fillstatic(this);
          from_93 = fillstatic(from);
          FillStaticLayerParams::MergeFrom(this_94,from_93);
        }
        else if (uVar1 == 0x442) {
          this_75 = mutable_filldynamic(this);
          from_75 = filldynamic(from);
          FillDynamicLayerParams::MergeFrom(this_75,from_75);
        }
        else if (uVar1 == 0x44c) {
          this_x00119 = mutable_broadcasttolike(this);
          from_x00118 = broadcasttolike(from);
          BroadcastToLikeLayerParams::MergeFrom(this_x00119,from_x00118);
        }
        else if (uVar1 == 0x451) {
          this_x00128 = mutable_broadcasttostatic(this);
          from_x00127 = broadcasttostatic(from);
          BroadcastToStaticLayerParams::MergeFrom(this_x00128,from_x00127);
        }
        else if (uVar1 == 0x456) {
          this_46 = mutable_broadcasttodynamic(this);
          from_46 = broadcasttodynamic(from);
          BroadcastToDynamicLayerParams::MergeFrom(this_46,from_46);
        }
        else if (uVar1 == 0x460) {
          this_53 = mutable_squeeze(this);
          from_53 = squeeze(from);
          SqueezeLayerParams::MergeFrom(this_53,from_53);
        }
        else if (uVar1 == 0x465) {
          this_52 = mutable_expanddims(this);
          from_52 = expanddims(from);
          ExpandDimsLayerParams::MergeFrom(this_52,from_52);
        }
        else if (uVar1 == 0x46a) {
          this_57 = mutable_flattento2d(this);
          from_57 = flattento2d(from);
          FlattenTo2DLayerParams::MergeFrom(this_57,from_57);
        }
        else if (uVar1 == 0x46f) {
          this_64 = mutable_reshapelike(this);
          from_64 = reshapelike(from);
          ReshapeLikeLayerParams::MergeFrom(this_64,from_64);
        }
        else if (uVar1 == 0x474) {
          this_x00108 = mutable_reshapestatic(this);
          from_x00107 = reshapestatic(from);
          ReshapeStaticLayerParams::MergeFrom(this_x00108,from_x00107);
        }
        else if (uVar1 == 0x479) {
          this_91 = mutable_reshapedynamic(this);
          from_91 = reshapedynamic(from);
          ReshapeDynamicLayerParams::MergeFrom(this_91,from_91);
        }
        else if (uVar1 == 0x47e) {
          this_x00107 = mutable_rankpreservingreshape(this);
          from_x00106 = rankpreservingreshape(from);
          RankPreservingReshapeLayerParams::MergeFrom(this_x00107,from_x00106);
        }
        else if (uVar1 == 0x483) {
          this_x00126 = mutable_constantpad(this);
          from_x00125 = constantpad(from);
          ConstantPaddingLayerParams::MergeFrom(this_x00126,from_x00125);
        }
        else if (uVar1 == 0x492) {
          this_x00125 = mutable_randomnormallike(this);
          from_x00124 = randomnormallike(from);
          RandomNormalLikeLayerParams::MergeFrom(this_x00125,from_x00124);
        }
        else if (uVar1 == 0x497) {
          this_56 = mutable_randomnormalstatic(this);
          from_56 = randomnormalstatic(from);
          RandomNormalStaticLayerParams::MergeFrom(this_56,from_56);
        }
        else if (uVar1 == 0x49c) {
          this_x00129 = mutable_randomnormaldynamic(this);
          from_x00128 = randomnormaldynamic(from);
          RandomNormalDynamicLayerParams::MergeFrom(this_x00129,from_x00128);
        }
        else if (uVar1 == 0x4a6) {
          this_81 = mutable_randomuniformlike(this);
          from_81 = randomuniformlike(from);
          RandomUniformLikeLayerParams::MergeFrom(this_81,from_81);
        }
        else if (uVar1 == 0x4ab) {
          this_82 = mutable_randomuniformstatic(this);
          from_82 = randomuniformstatic(from);
          RandomUniformStaticLayerParams::MergeFrom(this_82,from_82);
        }
        else if (uVar1 == 0x4b0) {
          this_x00124 = mutable_randomuniformdynamic(this);
          from_x00123 = randomuniformdynamic(from);
          RandomUniformDynamicLayerParams::MergeFrom(this_x00124,from_x00123);
        }
        else if (uVar1 == 0x4ba) {
          this_x00113 = mutable_randombernoullilike(this);
          from_x00112 = randombernoullilike(from);
          RandomBernoulliLikeLayerParams::MergeFrom(this_x00113,from_x00112);
        }
        else if (uVar1 == 0x4bf) {
          this_x00101 = mutable_randombernoullistatic(this);
          from_x00100 = randombernoullistatic(from);
          RandomBernoulliStaticLayerParams::MergeFrom(this_x00101,from_x00100);
        }
        else if (uVar1 == 0x4c4) {
          this_96 = mutable_randombernoullidynamic(this);
          from_95 = randombernoullidynamic(from);
          RandomBernoulliDynamicLayerParams::MergeFrom(this_96,from_95);
        }
        else if (uVar1 == 0x4ce) {
          this_x00120 = mutable_categoricaldistribution(this);
          from_x00119 = categoricaldistribution(from);
          CategoricalDistributionLayerParams::MergeFrom(this_x00120,from_x00119);
        }
        else if (uVar1 == 0x4e2) {
          this_x00104 = mutable_reducel1(this);
          from_x00103 = reducel1(from);
          ReduceL1LayerParams::MergeFrom(this_x00104,from_x00103);
        }
        else if (uVar1 == 0x4e7) {
          this_92 = mutable_reducel2(this);
          from_92 = reducel2(from);
          ReduceL2LayerParams::MergeFrom(this_92,from_92);
        }
        else if (uVar1 == 0x4ec) {
          this_60 = mutable_reducemax(this);
          from_60 = reducemax(from);
          ReduceMaxLayerParams::MergeFrom(this_60,from_60);
        }
        else if (uVar1 == 0x4f1) {
          this_84 = mutable_reducemin(this);
          from_84 = reducemin(from);
          ReduceMinLayerParams::MergeFrom(this_84,from_84);
        }
        else if (uVar1 == 0x4f6) {
          this_63 = mutable_reducesum(this);
          from_63 = reducesum(from);
          ReduceSumLayerParams::MergeFrom(this_63,from_63);
        }
        else if (uVar1 == 0x4fb) {
          this_x00102 = mutable_reduceprod(this);
          from_x00101 = reduceprod(from);
          ReduceProdLayerParams::MergeFrom(this_x00102,from_x00101);
        }
        else if (uVar1 == 0x500) {
          this_79 = mutable_reducemean(this);
          from_79 = reducemean(from);
          ReduceMeanLayerParams::MergeFrom(this_79,from_79);
        }
        else if (uVar1 == 0x505) {
          this_70 = mutable_reducelogsum(this);
          from_70 = reducelogsum(from);
          ReduceLogSumLayerParams::MergeFrom(this_70,from_70);
        }
        else if (uVar1 == 0x50a) {
          this_x00105 = mutable_reducesumsquare(this);
          from_x00104 = reducesumsquare(from);
          ReduceSumSquareLayerParams::MergeFrom(this_x00105,from_x00104);
        }
        else if (uVar1 == 0x50f) {
          this_80 = mutable_reducelogsumexp(this);
          from_80 = reducelogsumexp(from);
          ReduceLogSumExpLayerParams::MergeFrom(this_80,from_80);
        }
        else if (uVar1 == 0x521) {
          this_x00106 = mutable_wherenonzero(this);
          from_x00105 = wherenonzero(from);
          WhereNonZeroLayerParams::MergeFrom(this_x00106,from_x00105);
        }
        else if (uVar1 == 0x523) {
          this_88 = mutable_matrixbandpart(this);
          from_88 = matrixbandpart(from);
          MatrixBandPartLayerParams::MergeFrom(this_88,from_88);
        }
        else if (uVar1 == 0x528) {
          this_x00103 = mutable_lowertriangular(this);
          from_x00102 = lowertriangular(from);
          LowerTriangularLayerParams::MergeFrom(this_x00103,from_x00102);
        }
        else if (uVar1 == 0x52d) {
          this_98 = mutable_uppertriangular(this);
          from_97 = uppertriangular(from);
          UpperTriangularLayerParams::MergeFrom(this_98,from_97);
        }
        else if (uVar1 == 0x532) {
          this_74 = mutable_wherebroadcastable(this);
          from_74 = wherebroadcastable(from);
          WhereBroadcastableLayerParams::MergeFrom(this_74,from_74);
        }
        else if (uVar1 == 0x546) {
          this_87 = mutable_layernormalization(this);
          from_87 = layernormalization(from);
          LayerNormalizationLayerParams::MergeFrom(this_87,from_87);
        }
        else if (uVar1 == 0x578) {
          this_83 = mutable_nonmaximumsuppression(this);
          from_83 = nonmaximumsuppression(from);
          NonMaximumSuppressionLayerParams::MergeFrom(this_83,from_83);
        }
        else if (uVar1 == 100) {
          this_00 = mutable_convolution(this);
          from_00 = convolution(from);
          ConvolutionLayerParams::MergeFrom(this_00,from_00);
        }
      }
    }
  }
  return;
}

Assistant:

void NeuralNetworkLayer::MergeFrom(const NeuralNetworkLayer& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.NeuralNetworkLayer)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  input_.MergeFrom(from.input_);
  output_.MergeFrom(from.output_);
  inputtensor_.MergeFrom(from.inputtensor_);
  outputtensor_.MergeFrom(from.outputtensor_);
  if (from.name().size() > 0) {

    name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
  }
  if (from.isupdatable() != 0) {
    set_isupdatable(from.isupdatable());
  }
  switch (from.layer_case()) {
    case kConvolution: {
      mutable_convolution()->::CoreML::Specification::ConvolutionLayerParams::MergeFrom(from.convolution());
      break;
    }
    case kPooling: {
      mutable_pooling()->::CoreML::Specification::PoolingLayerParams::MergeFrom(from.pooling());
      break;
    }
    case kActivation: {
      mutable_activation()->::CoreML::Specification::ActivationParams::MergeFrom(from.activation());
      break;
    }
    case kInnerProduct: {
      mutable_innerproduct()->::CoreML::Specification::InnerProductLayerParams::MergeFrom(from.innerproduct());
      break;
    }
    case kEmbedding: {
      mutable_embedding()->::CoreML::Specification::EmbeddingLayerParams::MergeFrom(from.embedding());
      break;
    }
    case kBatchnorm: {
      mutable_batchnorm()->::CoreML::Specification::BatchnormLayerParams::MergeFrom(from.batchnorm());
      break;
    }
    case kMvn: {
      mutable_mvn()->::CoreML::Specification::MeanVarianceNormalizeLayerParams::MergeFrom(from.mvn());
      break;
    }
    case kL2Normalize: {
      mutable_l2normalize()->::CoreML::Specification::L2NormalizeLayerParams::MergeFrom(from.l2normalize());
      break;
    }
    case kSoftmax: {
      mutable_softmax()->::CoreML::Specification::SoftmaxLayerParams::MergeFrom(from.softmax());
      break;
    }
    case kLrn: {
      mutable_lrn()->::CoreML::Specification::LRNLayerParams::MergeFrom(from.lrn());
      break;
    }
    case kCrop: {
      mutable_crop()->::CoreML::Specification::CropLayerParams::MergeFrom(from.crop());
      break;
    }
    case kPadding: {
      mutable_padding()->::CoreML::Specification::PaddingLayerParams::MergeFrom(from.padding());
      break;
    }
    case kUpsample: {
      mutable_upsample()->::CoreML::Specification::UpsampleLayerParams::MergeFrom(from.upsample());
      break;
    }
    case kResizeBilinear: {
      mutable_resizebilinear()->::CoreML::Specification::ResizeBilinearLayerParams::MergeFrom(from.resizebilinear());
      break;
    }
    case kCropResize: {
      mutable_cropresize()->::CoreML::Specification::CropResizeLayerParams::MergeFrom(from.cropresize());
      break;
    }
    case kUnary: {
      mutable_unary()->::CoreML::Specification::UnaryFunctionLayerParams::MergeFrom(from.unary());
      break;
    }
    case kAdd: {
      mutable_add()->::CoreML::Specification::AddLayerParams::MergeFrom(from.add());
      break;
    }
    case kMultiply: {
      mutable_multiply()->::CoreML::Specification::MultiplyLayerParams::MergeFrom(from.multiply());
      break;
    }
    case kAverage: {
      mutable_average()->::CoreML::Specification::AverageLayerParams::MergeFrom(from.average());
      break;
    }
    case kScale: {
      mutable_scale()->::CoreML::Specification::ScaleLayerParams::MergeFrom(from.scale());
      break;
    }
    case kBias: {
      mutable_bias()->::CoreML::Specification::BiasLayerParams::MergeFrom(from.bias());
      break;
    }
    case kMax: {
      mutable_max()->::CoreML::Specification::MaxLayerParams::MergeFrom(from.max());
      break;
    }
    case kMin: {
      mutable_min()->::CoreML::Specification::MinLayerParams::MergeFrom(from.min());
      break;
    }
    case kDot: {
      mutable_dot()->::CoreML::Specification::DotProductLayerParams::MergeFrom(from.dot());
      break;
    }
    case kReduce: {
      mutable_reduce()->::CoreML::Specification::ReduceLayerParams::MergeFrom(from.reduce());
      break;
    }
    case kLoadConstant: {
      mutable_loadconstant()->::CoreML::Specification::LoadConstantLayerParams::MergeFrom(from.loadconstant());
      break;
    }
    case kReshape: {
      mutable_reshape()->::CoreML::Specification::ReshapeLayerParams::MergeFrom(from.reshape());
      break;
    }
    case kFlatten: {
      mutable_flatten()->::CoreML::Specification::FlattenLayerParams::MergeFrom(from.flatten());
      break;
    }
    case kPermute: {
      mutable_permute()->::CoreML::Specification::PermuteLayerParams::MergeFrom(from.permute());
      break;
    }
    case kConcat: {
      mutable_concat()->::CoreML::Specification::ConcatLayerParams::MergeFrom(from.concat());
      break;
    }
    case kSplit: {
      mutable_split()->::CoreML::Specification::SplitLayerParams::MergeFrom(from.split());
      break;
    }
    case kSequenceRepeat: {
      mutable_sequencerepeat()->::CoreML::Specification::SequenceRepeatLayerParams::MergeFrom(from.sequencerepeat());
      break;
    }
    case kReorganizeData: {
      mutable_reorganizedata()->::CoreML::Specification::ReorganizeDataLayerParams::MergeFrom(from.reorganizedata());
      break;
    }
    case kSlice: {
      mutable_slice()->::CoreML::Specification::SliceLayerParams::MergeFrom(from.slice());
      break;
    }
    case kSimpleRecurrent: {
      mutable_simplerecurrent()->::CoreML::Specification::SimpleRecurrentLayerParams::MergeFrom(from.simplerecurrent());
      break;
    }
    case kGru: {
      mutable_gru()->::CoreML::Specification::GRULayerParams::MergeFrom(from.gru());
      break;
    }
    case kUniDirectionalLSTM: {
      mutable_unidirectionallstm()->::CoreML::Specification::UniDirectionalLSTMLayerParams::MergeFrom(from.unidirectionallstm());
      break;
    }
    case kBiDirectionalLSTM: {
      mutable_bidirectionallstm()->::CoreML::Specification::BiDirectionalLSTMLayerParams::MergeFrom(from.bidirectionallstm());
      break;
    }
    case kCustom: {
      mutable_custom()->::CoreML::Specification::CustomLayerParams::MergeFrom(from.custom());
      break;
    }
    case kCopy: {
      mutable_copy()->::CoreML::Specification::CopyLayerParams::MergeFrom(from.copy());
      break;
    }
    case kBranch: {
      mutable_branch()->::CoreML::Specification::BranchLayerParams::MergeFrom(from.branch());
      break;
    }
    case kLoop: {
      mutable_loop()->::CoreML::Specification::LoopLayerParams::MergeFrom(from.loop());
      break;
    }
    case kLoopBreak: {
      mutable_loopbreak()->::CoreML::Specification::LoopBreakLayerParams::MergeFrom(from.loopbreak());
      break;
    }
    case kLoopContinue: {
      mutable_loopcontinue()->::CoreML::Specification::LoopContinueLayerParams::MergeFrom(from.loopcontinue());
      break;
    }
    case kRangeStatic: {
      mutable_rangestatic()->::CoreML::Specification::RangeStaticLayerParams::MergeFrom(from.rangestatic());
      break;
    }
    case kRangeDynamic: {
      mutable_rangedynamic()->::CoreML::Specification::RangeDynamicLayerParams::MergeFrom(from.rangedynamic());
      break;
    }
    case kClip: {
      mutable_clip()->::CoreML::Specification::ClipLayerParams::MergeFrom(from.clip());
      break;
    }
    case kCeil: {
      mutable_ceil()->::CoreML::Specification::CeilLayerParams::MergeFrom(from.ceil());
      break;
    }
    case kFloor: {
      mutable_floor()->::CoreML::Specification::FloorLayerParams::MergeFrom(from.floor());
      break;
    }
    case kSign: {
      mutable_sign()->::CoreML::Specification::SignLayerParams::MergeFrom(from.sign());
      break;
    }
    case kRound: {
      mutable_round()->::CoreML::Specification::RoundLayerParams::MergeFrom(from.round());
      break;
    }
    case kExp2: {
      mutable_exp2()->::CoreML::Specification::Exp2LayerParams::MergeFrom(from.exp2());
      break;
    }
    case kSin: {
      mutable_sin()->::CoreML::Specification::SinLayerParams::MergeFrom(from.sin());
      break;
    }
    case kCos: {
      mutable_cos()->::CoreML::Specification::CosLayerParams::MergeFrom(from.cos());
      break;
    }
    case kTan: {
      mutable_tan()->::CoreML::Specification::TanLayerParams::MergeFrom(from.tan());
      break;
    }
    case kAsin: {
      mutable_asin()->::CoreML::Specification::AsinLayerParams::MergeFrom(from.asin());
      break;
    }
    case kAcos: {
      mutable_acos()->::CoreML::Specification::AcosLayerParams::MergeFrom(from.acos());
      break;
    }
    case kAtan: {
      mutable_atan()->::CoreML::Specification::AtanLayerParams::MergeFrom(from.atan());
      break;
    }
    case kSinh: {
      mutable_sinh()->::CoreML::Specification::SinhLayerParams::MergeFrom(from.sinh());
      break;
    }
    case kCosh: {
      mutable_cosh()->::CoreML::Specification::CoshLayerParams::MergeFrom(from.cosh());
      break;
    }
    case kTanh: {
      mutable_tanh()->::CoreML::Specification::TanhLayerParams::MergeFrom(from.tanh());
      break;
    }
    case kAsinh: {
      mutable_asinh()->::CoreML::Specification::AsinhLayerParams::MergeFrom(from.asinh());
      break;
    }
    case kAcosh: {
      mutable_acosh()->::CoreML::Specification::AcoshLayerParams::MergeFrom(from.acosh());
      break;
    }
    case kAtanh: {
      mutable_atanh()->::CoreML::Specification::AtanhLayerParams::MergeFrom(from.atanh());
      break;
    }
    case kErf: {
      mutable_erf()->::CoreML::Specification::ErfLayerParams::MergeFrom(from.erf());
      break;
    }
    case kGelu: {
      mutable_gelu()->::CoreML::Specification::GeluLayerParams::MergeFrom(from.gelu());
      break;
    }
    case kEqual: {
      mutable_equal()->::CoreML::Specification::EqualLayerParams::MergeFrom(from.equal());
      break;
    }
    case kNotEqual: {
      mutable_notequal()->::CoreML::Specification::NotEqualLayerParams::MergeFrom(from.notequal());
      break;
    }
    case kLessThan: {
      mutable_lessthan()->::CoreML::Specification::LessThanLayerParams::MergeFrom(from.lessthan());
      break;
    }
    case kLessEqual: {
      mutable_lessequal()->::CoreML::Specification::LessEqualLayerParams::MergeFrom(from.lessequal());
      break;
    }
    case kGreaterThan: {
      mutable_greaterthan()->::CoreML::Specification::GreaterThanLayerParams::MergeFrom(from.greaterthan());
      break;
    }
    case kGreaterEqual: {
      mutable_greaterequal()->::CoreML::Specification::GreaterEqualLayerParams::MergeFrom(from.greaterequal());
      break;
    }
    case kLogicalOr: {
      mutable_logicalor()->::CoreML::Specification::LogicalOrLayerParams::MergeFrom(from.logicalor());
      break;
    }
    case kLogicalXor: {
      mutable_logicalxor()->::CoreML::Specification::LogicalXorLayerParams::MergeFrom(from.logicalxor());
      break;
    }
    case kLogicalNot: {
      mutable_logicalnot()->::CoreML::Specification::LogicalNotLayerParams::MergeFrom(from.logicalnot());
      break;
    }
    case kLogicalAnd: {
      mutable_logicaland()->::CoreML::Specification::LogicalAndLayerParams::MergeFrom(from.logicaland());
      break;
    }
    case kModBroadcastable: {
      mutable_modbroadcastable()->::CoreML::Specification::ModBroadcastableLayerParams::MergeFrom(from.modbroadcastable());
      break;
    }
    case kMinBroadcastable: {
      mutable_minbroadcastable()->::CoreML::Specification::MinBroadcastableLayerParams::MergeFrom(from.minbroadcastable());
      break;
    }
    case kMaxBroadcastable: {
      mutable_maxbroadcastable()->::CoreML::Specification::MaxBroadcastableLayerParams::MergeFrom(from.maxbroadcastable());
      break;
    }
    case kAddBroadcastable: {
      mutable_addbroadcastable()->::CoreML::Specification::AddBroadcastableLayerParams::MergeFrom(from.addbroadcastable());
      break;
    }
    case kPowBroadcastable: {
      mutable_powbroadcastable()->::CoreML::Specification::PowBroadcastableLayerParams::MergeFrom(from.powbroadcastable());
      break;
    }
    case kDivideBroadcastable: {
      mutable_dividebroadcastable()->::CoreML::Specification::DivideBroadcastableLayerParams::MergeFrom(from.dividebroadcastable());
      break;
    }
    case kFloorDivBroadcastable: {
      mutable_floordivbroadcastable()->::CoreML::Specification::FloorDivBroadcastableLayerParams::MergeFrom(from.floordivbroadcastable());
      break;
    }
    case kMultiplyBroadcastable: {
      mutable_multiplybroadcastable()->::CoreML::Specification::MultiplyBroadcastableLayerParams::MergeFrom(from.multiplybroadcastable());
      break;
    }
    case kSubtractBroadcastable: {
      mutable_subtractbroadcastable()->::CoreML::Specification::SubtractBroadcastableLayerParams::MergeFrom(from.subtractbroadcastable());
      break;
    }
    case kTile: {
      mutable_tile()->::CoreML::Specification::TileLayerParams::MergeFrom(from.tile());
      break;
    }
    case kStack: {
      mutable_stack()->::CoreML::Specification::StackLayerParams::MergeFrom(from.stack());
      break;
    }
    case kGather: {
      mutable_gather()->::CoreML::Specification::GatherLayerParams::MergeFrom(from.gather());
      break;
    }
    case kScatter: {
      mutable_scatter()->::CoreML::Specification::ScatterLayerParams::MergeFrom(from.scatter());
      break;
    }
    case kGatherND: {
      mutable_gathernd()->::CoreML::Specification::GatherNDLayerParams::MergeFrom(from.gathernd());
      break;
    }
    case kScatterND: {
      mutable_scatternd()->::CoreML::Specification::ScatterNDLayerParams::MergeFrom(from.scatternd());
      break;
    }
    case kSoftmaxND: {
      mutable_softmaxnd()->::CoreML::Specification::SoftmaxNDLayerParams::MergeFrom(from.softmaxnd());
      break;
    }
    case kGatherAlongAxis: {
      mutable_gatheralongaxis()->::CoreML::Specification::GatherAlongAxisLayerParams::MergeFrom(from.gatheralongaxis());
      break;
    }
    case kScatterAlongAxis: {
      mutable_scatteralongaxis()->::CoreML::Specification::ScatterAlongAxisLayerParams::MergeFrom(from.scatteralongaxis());
      break;
    }
    case kReverse: {
      mutable_reverse()->::CoreML::Specification::ReverseLayerParams::MergeFrom(from.reverse());
      break;
    }
    case kReverseSeq: {
      mutable_reverseseq()->::CoreML::Specification::ReverseSeqLayerParams::MergeFrom(from.reverseseq());
      break;
    }
    case kSplitND: {
      mutable_splitnd()->::CoreML::Specification::SplitNDLayerParams::MergeFrom(from.splitnd());
      break;
    }
    case kConcatND: {
      mutable_concatnd()->::CoreML::Specification::ConcatNDLayerParams::MergeFrom(from.concatnd());
      break;
    }
    case kTranspose: {
      mutable_transpose()->::CoreML::Specification::TransposeLayerParams::MergeFrom(from.transpose());
      break;
    }
    case kSliceStatic: {
      mutable_slicestatic()->::CoreML::Specification::SliceStaticLayerParams::MergeFrom(from.slicestatic());
      break;
    }
    case kSliceDynamic: {
      mutable_slicedynamic()->::CoreML::Specification::SliceDynamicLayerParams::MergeFrom(from.slicedynamic());
      break;
    }
    case kSlidingWindows: {
      mutable_slidingwindows()->::CoreML::Specification::SlidingWindowsLayerParams::MergeFrom(from.slidingwindows());
      break;
    }
    case kTopK: {
      mutable_topk()->::CoreML::Specification::TopKLayerParams::MergeFrom(from.topk());
      break;
    }
    case kArgMin: {
      mutable_argmin()->::CoreML::Specification::ArgMinLayerParams::MergeFrom(from.argmin());
      break;
    }
    case kArgMax: {
      mutable_argmax()->::CoreML::Specification::ArgMaxLayerParams::MergeFrom(from.argmax());
      break;
    }
    case kEmbeddingND: {
      mutable_embeddingnd()->::CoreML::Specification::EmbeddingNDLayerParams::MergeFrom(from.embeddingnd());
      break;
    }
    case kBatchedMatmul: {
      mutable_batchedmatmul()->::CoreML::Specification::BatchedMatMulLayerParams::MergeFrom(from.batchedmatmul());
      break;
    }
    case kGetShape: {
      mutable_getshape()->::CoreML::Specification::GetShapeLayerParams::MergeFrom(from.getshape());
      break;
    }
    case kLoadConstantND: {
      mutable_loadconstantnd()->::CoreML::Specification::LoadConstantNDLayerParams::MergeFrom(from.loadconstantnd());
      break;
    }
    case kFillLike: {
      mutable_filllike()->::CoreML::Specification::FillLikeLayerParams::MergeFrom(from.filllike());
      break;
    }
    case kFillStatic: {
      mutable_fillstatic()->::CoreML::Specification::FillStaticLayerParams::MergeFrom(from.fillstatic());
      break;
    }
    case kFillDynamic: {
      mutable_filldynamic()->::CoreML::Specification::FillDynamicLayerParams::MergeFrom(from.filldynamic());
      break;
    }
    case kBroadcastToLike: {
      mutable_broadcasttolike()->::CoreML::Specification::BroadcastToLikeLayerParams::MergeFrom(from.broadcasttolike());
      break;
    }
    case kBroadcastToStatic: {
      mutable_broadcasttostatic()->::CoreML::Specification::BroadcastToStaticLayerParams::MergeFrom(from.broadcasttostatic());
      break;
    }
    case kBroadcastToDynamic: {
      mutable_broadcasttodynamic()->::CoreML::Specification::BroadcastToDynamicLayerParams::MergeFrom(from.broadcasttodynamic());
      break;
    }
    case kSqueeze: {
      mutable_squeeze()->::CoreML::Specification::SqueezeLayerParams::MergeFrom(from.squeeze());
      break;
    }
    case kExpandDims: {
      mutable_expanddims()->::CoreML::Specification::ExpandDimsLayerParams::MergeFrom(from.expanddims());
      break;
    }
    case kFlattenTo2D: {
      mutable_flattento2d()->::CoreML::Specification::FlattenTo2DLayerParams::MergeFrom(from.flattento2d());
      break;
    }
    case kReshapeLike: {
      mutable_reshapelike()->::CoreML::Specification::ReshapeLikeLayerParams::MergeFrom(from.reshapelike());
      break;
    }
    case kReshapeStatic: {
      mutable_reshapestatic()->::CoreML::Specification::ReshapeStaticLayerParams::MergeFrom(from.reshapestatic());
      break;
    }
    case kReshapeDynamic: {
      mutable_reshapedynamic()->::CoreML::Specification::ReshapeDynamicLayerParams::MergeFrom(from.reshapedynamic());
      break;
    }
    case kRankPreservingReshape: {
      mutable_rankpreservingreshape()->::CoreML::Specification::RankPreservingReshapeLayerParams::MergeFrom(from.rankpreservingreshape());
      break;
    }
    case kConstantPad: {
      mutable_constantpad()->::CoreML::Specification::ConstantPaddingLayerParams::MergeFrom(from.constantpad());
      break;
    }
    case kRandomNormalLike: {
      mutable_randomnormallike()->::CoreML::Specification::RandomNormalLikeLayerParams::MergeFrom(from.randomnormallike());
      break;
    }
    case kRandomNormalStatic: {
      mutable_randomnormalstatic()->::CoreML::Specification::RandomNormalStaticLayerParams::MergeFrom(from.randomnormalstatic());
      break;
    }
    case kRandomNormalDynamic: {
      mutable_randomnormaldynamic()->::CoreML::Specification::RandomNormalDynamicLayerParams::MergeFrom(from.randomnormaldynamic());
      break;
    }
    case kRandomUniformLike: {
      mutable_randomuniformlike()->::CoreML::Specification::RandomUniformLikeLayerParams::MergeFrom(from.randomuniformlike());
      break;
    }
    case kRandomUniformStatic: {
      mutable_randomuniformstatic()->::CoreML::Specification::RandomUniformStaticLayerParams::MergeFrom(from.randomuniformstatic());
      break;
    }
    case kRandomUniformDynamic: {
      mutable_randomuniformdynamic()->::CoreML::Specification::RandomUniformDynamicLayerParams::MergeFrom(from.randomuniformdynamic());
      break;
    }
    case kRandomBernoulliLike: {
      mutable_randombernoullilike()->::CoreML::Specification::RandomBernoulliLikeLayerParams::MergeFrom(from.randombernoullilike());
      break;
    }
    case kRandomBernoulliStatic: {
      mutable_randombernoullistatic()->::CoreML::Specification::RandomBernoulliStaticLayerParams::MergeFrom(from.randombernoullistatic());
      break;
    }
    case kRandomBernoulliDynamic: {
      mutable_randombernoullidynamic()->::CoreML::Specification::RandomBernoulliDynamicLayerParams::MergeFrom(from.randombernoullidynamic());
      break;
    }
    case kCategoricalDistribution: {
      mutable_categoricaldistribution()->::CoreML::Specification::CategoricalDistributionLayerParams::MergeFrom(from.categoricaldistribution());
      break;
    }
    case kReduceL1: {
      mutable_reducel1()->::CoreML::Specification::ReduceL1LayerParams::MergeFrom(from.reducel1());
      break;
    }
    case kReduceL2: {
      mutable_reducel2()->::CoreML::Specification::ReduceL2LayerParams::MergeFrom(from.reducel2());
      break;
    }
    case kReduceMax: {
      mutable_reducemax()->::CoreML::Specification::ReduceMaxLayerParams::MergeFrom(from.reducemax());
      break;
    }
    case kReduceMin: {
      mutable_reducemin()->::CoreML::Specification::ReduceMinLayerParams::MergeFrom(from.reducemin());
      break;
    }
    case kReduceSum: {
      mutable_reducesum()->::CoreML::Specification::ReduceSumLayerParams::MergeFrom(from.reducesum());
      break;
    }
    case kReduceProd: {
      mutable_reduceprod()->::CoreML::Specification::ReduceProdLayerParams::MergeFrom(from.reduceprod());
      break;
    }
    case kReduceMean: {
      mutable_reducemean()->::CoreML::Specification::ReduceMeanLayerParams::MergeFrom(from.reducemean());
      break;
    }
    case kReduceLogSum: {
      mutable_reducelogsum()->::CoreML::Specification::ReduceLogSumLayerParams::MergeFrom(from.reducelogsum());
      break;
    }
    case kReduceSumSquare: {
      mutable_reducesumsquare()->::CoreML::Specification::ReduceSumSquareLayerParams::MergeFrom(from.reducesumsquare());
      break;
    }
    case kReduceLogSumExp: {
      mutable_reducelogsumexp()->::CoreML::Specification::ReduceLogSumExpLayerParams::MergeFrom(from.reducelogsumexp());
      break;
    }
    case kWhereNonZero: {
      mutable_wherenonzero()->::CoreML::Specification::WhereNonZeroLayerParams::MergeFrom(from.wherenonzero());
      break;
    }
    case kMatrixBandPart: {
      mutable_matrixbandpart()->::CoreML::Specification::MatrixBandPartLayerParams::MergeFrom(from.matrixbandpart());
      break;
    }
    case kLowerTriangular: {
      mutable_lowertriangular()->::CoreML::Specification::LowerTriangularLayerParams::MergeFrom(from.lowertriangular());
      break;
    }
    case kUpperTriangular: {
      mutable_uppertriangular()->::CoreML::Specification::UpperTriangularLayerParams::MergeFrom(from.uppertriangular());
      break;
    }
    case kWhereBroadcastable: {
      mutable_wherebroadcastable()->::CoreML::Specification::WhereBroadcastableLayerParams::MergeFrom(from.wherebroadcastable());
      break;
    }
    case kLayerNormalization: {
      mutable_layernormalization()->::CoreML::Specification::LayerNormalizationLayerParams::MergeFrom(from.layernormalization());
      break;
    }
    case kNonMaximumSuppression: {
      mutable_nonmaximumsuppression()->::CoreML::Specification::NonMaximumSuppressionLayerParams::MergeFrom(from.nonmaximumsuppression());
      break;
    }
    case kOneHot: {
      mutable_onehot()->::CoreML::Specification::OneHotLayerParams::MergeFrom(from.onehot());
      break;
    }
    case kCumSum: {
      mutable_cumsum()->::CoreML::Specification::CumSumLayerParams::MergeFrom(from.cumsum());
      break;
    }
    case kClampedReLU: {
      mutable_clampedrelu()->::CoreML::Specification::ClampedReLULayerParams::MergeFrom(from.clampedrelu());
      break;
    }
    case kArgSort: {
      mutable_argsort()->::CoreML::Specification::ArgSortLayerParams::MergeFrom(from.argsort());
      break;
    }
    case kPooling3D: {
      mutable_pooling3d()->::CoreML::Specification::Pooling3DLayerParams::MergeFrom(from.pooling3d());
      break;
    }
    case kGlobalPooling3D: {
      mutable_globalpooling3d()->::CoreML::Specification::GlobalPooling3DLayerParams::MergeFrom(from.globalpooling3d());
      break;
    }
    case kSliceBySize: {
      mutable_slicebysize()->::CoreML::Specification::SliceBySizeLayerParams::MergeFrom(from.slicebysize());
      break;
    }
    case kConvolution3D: {
      mutable_convolution3d()->::CoreML::Specification::Convolution3DLayerParams::MergeFrom(from.convolution3d());
      break;
    }
    case LAYER_NOT_SET: {
      break;
    }
  }
}